

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

long jsteemann::atoi_negative<long>(char *p,char *e,int *errcode)

{
  char cVar1;
  bool local_44;
  bool local_42;
  char *pcStack_40;
  char c;
  long result;
  char cutlim;
  long cutoff;
  int *errcode_local;
  char *e_local;
  char *p_local;
  
  if (p == e) {
    *errcode = -1;
    p_local = (char *)0x0;
  }
  else {
    pcStack_40 = (char *)0x0;
    e_local = p;
    do {
      cVar1 = *e_local;
      if ((((cVar1 == '\0') || (cVar1 == ' ')) || (cVar1 == '\t')) ||
         (((cVar1 == '\n' || (cVar1 == '\r')) || ((cVar1 == '\v' || (cVar1 == '\f')))))) {
        *errcode = 0;
        return (long)pcStack_40;
      }
      local_42 = cVar1 < '0' || '9' < cVar1;
      if (local_42) {
        *errcode = -1;
        return (long)pcStack_40;
      }
      local_44 = true;
      if (-0xccccccccccccccd < (long)pcStack_40) {
        local_44 = pcStack_40 == (char *)0xf333333333333334 && '\b' < (char)(cVar1 + -0x30);
      }
      if (local_44) {
        *errcode = -4;
        return (long)pcStack_40;
      }
      pcStack_40 = (char *)((long)pcStack_40 * 10 - (long)(char)(cVar1 + -0x30));
      e_local = e_local + 1;
    } while (e_local < e);
    *errcode = 0;
    p_local = pcStack_40;
  }
  return (long)p_local;
}

Assistant:

inline T atoi_negative(char const* p, char const* e, int& errcode) JSTEEMANN_NOEXCEPT {
  if (ATOI_UNLIKELY(p == e)) {
    errcode = -1;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::min)() / 10;
  constexpr char cutlim = -((std::numeric_limits<T>::min)() % 10);
  T result = 0;

  do {
    char c = *p;

    if ((c == '\0') || (c == ' ') || (c == '\t') || (c == '\n') || (c == '\r') || (c == '\v') || (c == '\f')) {
      errcode = 0;
      return result;
    }

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      errcode = -1;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result < cutoff || (result == cutoff && c > cutlim))) {
      errcode = -4;
      return result;
    }
    result *= 10;
    result -= c;
  } while (++p < e);

  errcode = 0;
  return result;
}